

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::Assignment::dump_abi_cxx11_
          (string *__return_storage_ptr__,Assignment *this,int level)

{
  Expression *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a0,(char)level);
  std::operator+(&local_80,&local_a0,"Assignment: ");
  std::operator+(&local_60,&local_80,&this->name);
  std::operator+(&local_40,&local_60," = ");
  pEVar1 = (this->value)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))
            (&local_c0,pEVar1,level + 1);
  std::operator+(__return_storage_ptr__,&local_40,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Assignment::dump(int level) const {
    return std::string(level, '\t')+"Assignment: "+name+" = "+value->dump(level+1);
}